

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O1

void __thiscall
TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontNonSym<float>_>::~TPZFrontMatrix
          (TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontNonSym<float>_> *this,void **vtt
          )

{
  int *piVar1;
  
  (this->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)*vtt;
  (this->fNumElConnectedBackup)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  piVar1 = (this->fNumElConnectedBackup).fStore;
  if (piVar1 != (int *)0x0) {
    operator_delete__(piVar1);
  }
  (this->fNumElConnected)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  piVar1 = (this->fNumElConnected).fStore;
  if (piVar1 != (int *)0x0) {
    operator_delete__(piVar1);
  }
  TPZFrontNonSym<float>::~TPZFrontNonSym(&this->fFront);
  TPZStackEqnStorage<float>::~TPZStackEqnStorage(&this->fStorage);
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::~TPZFrontMatrix(){
}